

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

uint av1_refine_warped_mv
               (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
               BLOCK_SIZE bsize,int *pts0,int *pts_inref0,int total_samples,
               WARP_SEARCH_METHOD search_method,int num_iterations)

{
  uint uVar1;
  int mi_row;
  int mi_col;
  uint8_t uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  size_t __n;
  uint8_t uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  MV *pMVar8;
  BLOCK_SIZE bsize_00;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte local_175;
  MV local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  MB_MODE_INFO *local_160;
  MV *local_158;
  WarpedMotionParams *local_150;
  uint local_144;
  ulong local_140;
  WarpedMotionParams best_wm_params;
  int pts_inref [16];
  int pts [16];
  
  local_160 = *xd->mi;
  lVar9 = (ulong)search_method * 0x2c;
  uVar1 = warp_search_info[search_method].num_neighbors;
  local_158 = (MV *)local_160->mv;
  local_150 = &local_160->wm_params;
  best_wm_params.wmtype = (local_160->wm_params).wmtype;
  best_wm_params.invalid = (local_160->wm_params).invalid;
  best_wm_params._34_2_ = *(undefined2 *)&(local_160->wm_params).field_0x22;
  best_wm_params.wmmat._0_16_ = *(undefined1 (*) [16])(local_160->wm_params).wmmat;
  best_wm_params.wmmat[4]._0_2_ = (undefined2)(local_160->wm_params).wmmat[4];
  best_wm_params.wmmat[4]._2_2_ = *(undefined2 *)((long)(local_160->wm_params).wmmat + 0x12);
  best_wm_params.wmmat[5]._0_2_ = (undefined2)(local_160->wm_params).wmmat[5];
  best_wm_params.wmmat[5]._2_2_ = *(undefined2 *)((long)(local_160->wm_params).wmmat + 0x16);
  best_wm_params.alpha = (local_160->wm_params).alpha;
  best_wm_params.beta = (local_160->wm_params).beta;
  best_wm_params.gamma = (local_160->wm_params).gamma;
  best_wm_params.delta = (local_160->wm_params).delta;
  uVar4 = local_160->num_proj_ref;
  iVar3 = ms_params->allow_hp;
  local_144 = (uint)CONCAT71(in_register_00000009,bsize);
  local_16c = compute_motion_cost(xd,cm,ms_params,bsize,local_158);
  if (0 < num_iterations) {
    mi_row = xd->mi_row;
    mi_col = xd->mi_col;
    __n = (long)(total_samples * 2) << 2;
    local_175 = 0xff;
    uVar7 = 0;
    auVar11 = ZEXT116(iVar3 == 0);
    pMVar8 = local_158;
    do {
      if ((int)uVar1 < 1) {
        local_164 = 0xffffffff;
      }
      else {
        local_164 = 0xffffffff;
        uVar5 = 0;
        local_140 = uVar7;
        do {
          if ((local_175 >> ((uint)uVar5 & 0x1f) & 1) != 0) {
            auVar10 = psllw(ZEXT416(*(uint *)(lVar9 + 0x4e3154 + uVar5 * 4)),auVar11);
            local_170.row = auVar10._0_2_ + pMVar8->row;
            local_170.col = auVar10._2_2_ + pMVar8->col;
            if (((((ms_params->mv_limits).col_min <= (int)local_170.col) &&
                 ((int)local_170.col <= (ms_params->mv_limits).col_max)) &&
                ((ms_params->mv_limits).row_min <= (int)local_170.row)) &&
               ((int)local_170.row <= (ms_params->mv_limits).row_max)) {
              memcpy(pts,pts0,__n);
              memcpy(pts_inref,pts_inref0,__n);
              local_168 = local_144 & 0xff;
              bsize_00 = (BLOCK_SIZE)local_144;
              if (1 < total_samples) {
                uVar2 = av1_selectSamples(&local_170,pts,pts_inref,total_samples,
                                          (BLOCK_SIZE)local_144);
                bsize_00 = (BLOCK_SIZE)local_168;
                local_160->num_proj_ref = uVar2;
              }
              iVar3 = av1_find_projection((uint)local_160->num_proj_ref,pts,pts_inref,bsize_00,
                                          (int)local_170.row,(int)local_170.col,local_150,mi_row,
                                          mi_col);
              uVar7 = local_140;
              pMVar8 = local_158;
              if ((iVar3 == 0) &&
                 (uVar6 = compute_motion_cost(xd,cm,ms_params,(BLOCK_SIZE)local_168,&local_170),
                 uVar7 = local_140, pMVar8 = local_158, uVar6 < local_16c)) {
                best_wm_params.wmtype = local_150->wmtype;
                best_wm_params.invalid = local_150->invalid;
                best_wm_params._34_2_ = *(undefined2 *)&local_150->field_0x22;
                best_wm_params.wmmat._0_16_ = *(undefined1 (*) [16])local_150->wmmat;
                best_wm_params.wmmat[4]._0_2_ = (undefined2)local_150->wmmat[4];
                best_wm_params.wmmat[4]._2_2_ = *(undefined2 *)((long)local_150->wmmat + 0x12);
                best_wm_params.wmmat[5]._0_2_ = (undefined2)local_150->wmmat[5];
                best_wm_params.wmmat[5]._2_2_ = *(undefined2 *)((long)local_150->wmmat + 0x16);
                best_wm_params.alpha = local_150->alpha;
                best_wm_params.beta = local_150->beta;
                best_wm_params.gamma = local_150->gamma;
                best_wm_params.delta = local_150->delta;
                uVar4 = local_160->num_proj_ref;
                local_164 = (uint)uVar5;
                local_16c = uVar6;
              }
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      if (-1 < (int)local_164) {
        auVar10 = psllw(ZEXT416(*(uint *)(lVar9 + 0x4e3154 + (ulong)local_164 * 4)),auVar11);
        pMVar8->row = (*pMVar8).row + auVar10._0_2_;
        pMVar8->col = (*pMVar8).col + auVar10._2_2_;
        local_175 = *(byte *)(lVar9 + 0x4e3174 + (ulong)local_164);
      }
    } while ((local_164 != 0xffffffff) &&
            (uVar6 = (int)uVar7 + 1, uVar7 = (ulong)uVar6, uVar6 != num_iterations));
  }
  local_150->wmtype = best_wm_params.wmtype;
  local_150->invalid = best_wm_params.invalid;
  *(undefined2 *)&local_150->field_0x22 = best_wm_params._34_2_;
  *(ulong *)(local_150->wmmat + 4) =
       CONCAT26(best_wm_params.wmmat[5]._2_2_,
                CONCAT24((undefined2)best_wm_params.wmmat[5],
                         CONCAT22(best_wm_params.wmmat[4]._2_2_,(undefined2)best_wm_params.wmmat[4])
                        ));
  local_150->alpha = best_wm_params.alpha;
  local_150->beta = best_wm_params.beta;
  local_150->gamma = best_wm_params.gamma;
  local_150->delta = best_wm_params.delta;
  *(undefined8 *)local_150->wmmat = best_wm_params.wmmat._0_8_;
  *(undefined8 *)(local_150->wmmat + 2) = best_wm_params.wmmat._8_8_;
  local_160->num_proj_ref = uVar4;
  return local_16c;
}

Assistant:

unsigned int av1_refine_warped_mv(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                  const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  BLOCK_SIZE bsize, const int *pts0,
                                  const int *pts_inref0, int total_samples,
                                  WARP_SEARCH_METHOD search_method,
                                  int num_iterations) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  const MV *neighbors = warp_search_info[search_method].neighbors;
  const int num_neighbors = warp_search_info[search_method].num_neighbors;
  const uint8_t *neighbor_mask = warp_search_info[search_method].neighbor_mask;

  MV *best_mv = &mbmi->mv[0].as_mv;

  WarpedMotionParams best_wm_params = mbmi->wm_params;
  int best_num_proj_ref = mbmi->num_proj_ref;
  unsigned int bestmse;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  const int mv_shift = ms_params->allow_hp ? 0 : 1;

  // Calculate the center position's error
  assert(av1_is_subpelmv_in_range(mv_limits, *best_mv));
  bestmse = compute_motion_cost(xd, cm, ms_params, bsize, best_mv);

  // MV search
  int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // First step always scans all neighbors
  uint8_t valid_neighbors = UINT8_MAX;

  for (int ite = 0; ite < num_iterations; ++ite) {
    int best_idx = -1;

    for (int idx = 0; idx < num_neighbors; ++idx) {
      if ((valid_neighbors & (1 << idx)) == 0) {
        continue;
      }

      unsigned int thismse;

      MV this_mv = { best_mv->row + neighbors[idx].row * (1 << mv_shift),
                     best_mv->col + neighbors[idx].col * (1 << mv_shift) };
      if (av1_is_subpelmv_in_range(mv_limits, this_mv)) {
        memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
        memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
        if (total_samples > 1) {
          mbmi->num_proj_ref =
              av1_selectSamples(&this_mv, pts, pts_inref, total_samples, bsize);
        }

        if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                                 this_mv.row, this_mv.col, &mbmi->wm_params,
                                 mi_row, mi_col)) {
          thismse = compute_motion_cost(xd, cm, ms_params, bsize, &this_mv);

          if (thismse < bestmse) {
            best_idx = idx;
            best_wm_params = mbmi->wm_params;
            best_num_proj_ref = mbmi->num_proj_ref;
            bestmse = thismse;
          }
        }
      }
    }

    if (best_idx == -1) break;

    if (best_idx >= 0) {
      best_mv->row += neighbors[best_idx].row * (1 << mv_shift);
      best_mv->col += neighbors[best_idx].col * (1 << mv_shift);
      valid_neighbors = neighbor_mask[best_idx];
    }
  }

  mbmi->wm_params = best_wm_params;
  mbmi->num_proj_ref = best_num_proj_ref;
  return bestmse;
}